

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_2::FileState::Truncate(FileState *this)

{
  long lVar1;
  pointer ppcVar2;
  char **block;
  pointer ppcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->blocks_mutex_).mu_);
  ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar3 != ppcVar2; ppcVar3 = ppcVar3 + 1) {
    if (*ppcVar3 != (char *)0x0) {
      operator_delete__(*ppcVar3);
    }
  }
  ppcVar3 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar3) {
    (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3;
  }
  this->size_ = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_mutex_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Truncate() {
    MutexLock lock(&blocks_mutex_);
    for (char*& block : blocks_) {
      delete[] block;
    }
    blocks_.clear();
    size_ = 0;
  }